

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O0

void __thiscall
xmrig::WorkerJob<4UL>::add(WorkerJob<4UL> *this,Job *job,uint32_t reserveCount,Backend backend)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  Backend in_EDX;
  int __c;
  int __c_00;
  Job *in_RSI;
  Job *__s;
  WorkerJob<4UL> *in_RDI;
  Job *in_stack_ffffffffffffffd8;
  
  uVar2 = Nonce::sequence(in_EDX);
  in_RDI->m_sequence = uVar2;
  currentJob(in_RDI);
  __s = in_RSI;
  bVar1 = Job::operator==((Job *)in_RDI,in_stack_ffffffffffffffd8);
  if (!bVar1) {
    pcVar3 = index(in_RDI,(char *)__s,__c);
    if (((((uint)pcVar3 & 0xff) == 1) &&
        (pcVar3 = Job::index(in_RSI,(char *)__s,__c_00), ((ulong)pcVar3 & 0xff) == 0)) &&
       (bVar1 = Job::operator==((Job *)in_RDI,in_stack_ffffffffffffffd8), bVar1)) {
      in_RDI->m_index = '\0';
    }
    else {
      save(this,job,reserveCount,backend);
    }
  }
  return;
}

Assistant:

inline void add(const Job &job, uint32_t reserveCount, Nonce::Backend backend)
    {
        m_sequence = Nonce::sequence(backend);

        if (currentJob() == job) {
            return;
        }

        if (index() == 1 && job.index() == 0 && job == m_jobs[0]) {
            m_index = 0;
            return;
        }

        save(job, reserveCount, backend);
    }